

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_send_ws_header(mg_connection *nc,int op,size_t len,ws_mask_ctx *ctx)

{
  uint16_t uVar1;
  uint32_t uVar2;
  char local_36;
  byte local_35;
  uint32_t tmp_1;
  uint16_t tmp;
  uchar header [10];
  int header_len;
  ws_mask_ctx *ctx_local;
  size_t len_local;
  int op_local;
  mg_connection *nc_local;
  
  local_36 = -0x80;
  if ((op & 0x100U) != 0) {
    local_36 = '\0';
  }
  local_36 = local_36 + ((byte)op & 0xf);
  unique0x10000118 = ctx;
  if (len < 0x7e) {
    local_35 = (byte)len;
    header[2] = '\x02';
    header[3] = '\0';
    header[4] = '\0';
    header[5] = '\0';
  }
  else if (len < 0xffff) {
    uVar1 = htons((uint16_t)len);
    local_35 = 0x7e;
    tmp_1 = CONCAT22(tmp_1._2_2_,uVar1);
    header[2] = '\x04';
    header[3] = '\0';
    header[4] = '\0';
    header[5] = '\0';
  }
  else {
    local_35 = 0x7f;
    tmp_1 = htonl((uint32_t)(len >> 0x20));
    _tmp = htonl((uint32_t)len);
    header[2] = '\n';
    header[3] = '\0';
    header[4] = '\0';
    header[5] = '\0';
  }
  if (nc->listener == (mg_connection *)0x0) {
    local_35 = local_35 | 0x80;
    mg_send(nc,&local_36,header._2_4_);
    uVar2 = ws_random_mask();
    stack0xffffffffffffffd8->mask = uVar2;
    mg_send(nc,&stack0xffffffffffffffd8->mask,4);
    stack0xffffffffffffffd8->pos = (nc->send_mbuf).len;
  }
  else {
    mg_send(nc,&local_36,header._2_4_);
    stack0xffffffffffffffd8->pos = 0;
  }
  return;
}

Assistant:

static void mg_send_ws_header(struct mg_connection *nc, int op, size_t len,
                              struct ws_mask_ctx *ctx) {
    int header_len;
    unsigned char header[10];

    header[0] = (op & WEBSOCKET_DONT_FIN ? 0x0 : 0x80) + (op & 0x0f);
    if (len < 126) {
        header[1] = len;
        header_len = 2;
    } else if (len < 65535) {
        uint16_t tmp = htons((uint16_t) len);
        header[1] = 126;
        memcpy(&header[2], &tmp, sizeof(tmp));
        header_len = 4;
    } else {
        uint32_t tmp;
        header[1] = 127;
        tmp = htonl((uint32_t) ((uint64_t) len >> 32));
        memcpy(&header[2], &tmp, sizeof(tmp));
        tmp = htonl((uint32_t) (len & 0xffffffff));
        memcpy(&header[6], &tmp, sizeof(tmp));
        header_len = 10;
    }

    /* client connections enable masking */
    if (nc->listener == NULL) {
        header[1] |= 1 << 7; /* set masking flag */
        mg_send(nc, header, header_len);
        ctx->mask = ws_random_mask();
        mg_send(nc, &ctx->mask, sizeof(ctx->mask));
        ctx->pos = nc->send_mbuf.len;
    } else {
        mg_send(nc, header, header_len);
        ctx->pos = 0;
    }
}